

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::
     map_slot_policy<std::basic_string_view<char,std::char_traits<char>>,absl::CommandLineFlag*>::
     construct<std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::CommandLineFlag*>>,std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>,std::tuple<absl::CommandLineFlag*&&>>
               (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_1,
               tuple<absl::CommandLineFlag_*&&> *args_2)

{
  tuple<absl::CommandLineFlag_*&&> *args_local_2;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>
  *alloc_local;
  
  map_slot_policy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>::
  emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::CommandLineFlag*>>>
  ::
  construct<std::pair<std::basic_string_view<char,std::char_traits<char>>,absl::CommandLineFlag*>,std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>,std::tuple<absl::CommandLineFlag*&&>>
            (alloc,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }